

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_nminmax_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0,uint32_t op1,
          GLSLstd450 op)

{
  uint32_t result_id;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  uint32_t uVar1;
  char *pcVar2;
  uint32_t op0_00;
  uint32_t left;
  uint32_t uVar3;
  mapped_type *pmVar4;
  SPIRType *pSVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  uint uVar8;
  SPIRType btype;
  uint32_t local_198;
  uint32_t local_194;
  uint32_t local_190;
  uint32_t local_18c;
  GLSLstd450 local_188;
  key_type local_184;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_198 = id;
  local_188 = op;
  pmVar4 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->extra_sub_expressions,&local_198);
  if (*pmVar4 == 0) {
    uVar3 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,5);
    *pmVar4 = uVar3;
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        result_type);
    SPIRType::SPIRType((SPIRType *)local_180,pSVar5);
    local_180._12_4_ = 2;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              (&this->super_Compiler,*pmVar4,(SPIRType *)local_180);
    local_180._0_8_ = &PTR__SPIRType_003fd210;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_180._144_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
      free((void *)local_180._136_8_);
    }
    local_180._96_8_ = 0;
    if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
      free((void *)local_180._88_8_);
    }
    local_180._40_8_ = 0;
    if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
      free((void *)local_180._32_8_);
    }
  }
  uVar1 = *pmVar4;
  uVar3 = uVar1 + 1;
  result_id = uVar1 + 2;
  this_00 = &(this->super_Compiler).ir.meta;
  local_180._0_4_ = local_198;
  local_194 = op0;
  pmVar6 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)local_180);
  local_190 = uVar1 + 3;
  local_184.id = uVar1 + 3;
  pmVar7 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_184);
  Meta::operator=(pmVar7,pmVar6);
  local_180._0_4_ = local_198;
  pmVar6 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)local_180);
  local_18c = uVar1 + 4;
  local_184.id = uVar1 + 4;
  pmVar7 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_184);
  Meta::operator=(pmVar7,pmVar6);
  op0_00 = local_194;
  uVar8 = 0x81;
  if ((this->options).es != false) {
    uVar8 = 299;
  }
  if (uVar8 < (this->options).version) {
    emit_unary_func_op(this,uVar1,uVar3,local_194,"isnan");
    emit_unary_func_op(this,uVar1,result_id,op1,"isnan");
  }
  else {
    pSVar5 = Compiler::expression_type(&this->super_Compiler,local_194);
    if (pSVar5->vecsize < 2) {
      emit_binary_op(this,uVar1,uVar3,op0_00,op0_00,"!=");
      emit_binary_op(this,uVar1,result_id,op1,op1,"!=");
    }
    else {
      emit_binary_func_op(this,uVar1,uVar3,op0_00,op0_00,"notEqual");
      emit_binary_func_op(this,uVar1,result_id,op1,op1,"notEqual");
    }
  }
  uVar1 = local_190;
  pcVar2 = "precise::max";
  if (local_188 == GLSLstd450NMin) {
    pcVar2 = "precise::min";
  }
  emit_binary_func_op(this,result_type,local_190,op0_00,op1,pcVar2 + 9);
  left = local_18c;
  emit_mix_op(this,result_type,local_18c,uVar1,op1,uVar3);
  emit_mix_op(this,result_type,local_198,left,op0_00,result_id);
  return;
}

Assistant:

void CompilerGLSL::emit_nminmax_op(uint32_t result_type, uint32_t id, uint32_t op0, uint32_t op1, GLSLstd450 op)
{
	// Need to emulate this call.
	uint32_t &ids = extra_sub_expressions[id];
	if (!ids)
	{
		ids = ir.increase_bound_by(5);
		auto btype = get<SPIRType>(result_type);
		btype.basetype = SPIRType::Boolean;
		set<SPIRType>(ids, btype);
	}

	uint32_t btype_id = ids + 0;
	uint32_t left_nan_id = ids + 1;
	uint32_t right_nan_id = ids + 2;
	uint32_t tmp_id = ids + 3;
	uint32_t mixed_first_id = ids + 4;

	// Inherit precision qualifiers.
	ir.meta[tmp_id] = ir.meta[id];
	ir.meta[mixed_first_id] = ir.meta[id];

	if (!is_legacy())
	{
		emit_unary_func_op(btype_id, left_nan_id, op0, "isnan");
		emit_unary_func_op(btype_id, right_nan_id, op1, "isnan");
	}
	else if (expression_type(op0).vecsize > 1)
	{
		// If the number doesn't equal itself, it must be NaN
		emit_binary_func_op(btype_id, left_nan_id, op0, op0, "notEqual");
		emit_binary_func_op(btype_id, right_nan_id, op1, op1, "notEqual");
	}
	else
	{
		emit_binary_op(btype_id, left_nan_id, op0, op0, "!=");
		emit_binary_op(btype_id, right_nan_id, op1, op1, "!=");
	}
	emit_binary_func_op(result_type, tmp_id, op0, op1, op == GLSLstd450NMin ? "min" : "max");
	emit_mix_op(result_type, mixed_first_id, tmp_id, op1, left_nan_id);
	emit_mix_op(result_type, id, mixed_first_id, op0, right_nan_id);
}